

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall QHttp2Configuration::~QHttp2Configuration(QHttp2Configuration *this)

{
  QHttp2ConfigurationPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QHttp2ConfigurationPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value == (__atomic_base<int>)0x0) {
      operator_delete((this->d).d.ptr,0x18);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }